

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O2

string * __thiscall
ZXing::ToHex_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,ByteArray *bytes)

{
  size_t i;
  ulong uVar1;
  long lVar2;
  string res;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&res,((char)*(undefined8 *)(this + 8) - (char)*(undefined8 *)this) * '\x03');
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(*(long *)(this + 8) - *(long *)this); uVar1 = uVar1 + 1) {
    snprintf(res._M_dataplus._M_p + lVar2,4,"%02X ",(ulong)*(byte *)(*(long *)this + uVar1));
    lVar2 = lVar2 + 3;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&res);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ToHex(const ByteArray& bytes)
{
	std::string res(bytes.size() * 3, ' ');

	for (size_t i = 0; i < bytes.size(); ++i)
	{
#ifdef _MSC_VER
		sprintf_s(&res[i * 3], 4, "%02X ", bytes[i]);
#else
		snprintf(&res[i * 3], 4, "%02X ", bytes[i]);
#endif
	}

	return res.substr(0, res.size()-1);
}